

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tipc_listener.cpp
# Opt level: O0

int __thiscall
zmq::tipc_listener_t::accept(tipc_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int *piVar1;
  char *pcVar2;
  bool bVar3;
  char *errstr;
  fd_t sock;
  socklen_t ss_len;
  sockaddr_storage ss;
  socklen_t local_94;
  sockaddr local_90 [8];
  tipc_listener_t *local_10;
  int local_4;
  
  local_10 = this;
  memset(local_90,0,0x80);
  local_94 = 0x80;
  if ((this->super_stream_listener_base_t)._s == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tipc_listener.cpp"
            ,0x9d);
    fflush(_stderr);
    zmq_abort((char *)0x2f2813);
  }
  local_4 = ::accept((this->super_stream_listener_base_t)._s,local_90,&local_94);
  if (local_4 == -1) {
    piVar1 = __errno_location();
    bVar3 = true;
    if (*piVar1 != 0xb) {
      piVar1 = __errno_location();
      bVar3 = true;
      if (*piVar1 != 0xb) {
        piVar1 = __errno_location();
        bVar3 = true;
        if (*piVar1 != 0x69) {
          piVar1 = __errno_location();
          bVar3 = true;
          if (*piVar1 != 4) {
            piVar1 = __errno_location();
            bVar3 = true;
            if (*piVar1 != 0x67) {
              piVar1 = __errno_location();
              bVar3 = true;
              if (*piVar1 != 0x47) {
                piVar1 = __errno_location();
                bVar3 = true;
                if (*piVar1 != 0x18) {
                  piVar1 = __errno_location();
                  bVar3 = *piVar1 == 0x17;
                }
              }
            }
          }
        }
      }
    }
    if (!bVar3) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tipc_listener.cpp"
              ,0xa8);
      fflush(_stderr);
      zmq_abort((char *)0x2f2938);
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

zmq::fd_t zmq::tipc_listener_t::accept ()
{
    //  Accept one connection and deal with different failure modes.
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    struct sockaddr_storage ss = {};
    socklen_t ss_len = sizeof (ss);

    zmq_assert (_s != retired_fd);
#ifdef ZMQ_HAVE_VXWORKS
    fd_t sock = ::accept (_s, (struct sockaddr *) &ss, (int *) &ss_len);
#else
    fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif
    if (sock == -1) {
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK
                      || errno == ENOBUFS || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == EMFILE || errno == ENFILE);
        return retired_fd;
    }
    /*FIXME Accept filters?*/
    return sock;
}